

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketContext.h
# Opt level: O2

bool uWS::WebSocketContext<true,_true>::handleFragment
               (char *data,size_t length,uint remainingBytes,int opCode,bool fin,
               WebSocketState<true> *webSocketState,void *s)

{
  string_view compressed;
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  function *this;
  long lVar4;
  char *src;
  long lVar5;
  size_t sVar6;
  uchar *s_00;
  bool bVar7;
  string_view compressed_00;
  string_view message;
  char *local_58;
  CloseFrame closeFrame;
  
  uVar3 = us_socket_context(1,s);
  this = (function *)us_socket_context_ext(1,uVar3);
  lVar4 = us_socket_ext(1,s);
  bVar7 = remainingBytes != 0;
  if (2 < opCode) {
    if ((!bVar7 && fin) && (*(int *)(lVar4 + 0x58) == 0)) {
      if (opCode == 10) {
        bVar7 = fu2::abi_400::detail::function::operator_cast_to_bool(this + 0x80);
        if (!bVar7) {
          return false;
        }
        (**(code **)(this + 0x98))(this + 0x80,0x10,s);
      }
      else {
        if (opCode != 9) {
          if (opCode != 8) {
            return false;
          }
          protocol::parseClosePayload(&closeFrame,data,length);
          sVar6 = CONCAT71(closeFrame.length._1_7_,(char)closeFrame.length);
LAB_0017537c:
          message._M_str = closeFrame.message;
          message._M_len = sVar6;
          WebSocket<true,_true>::end((WebSocket<true,_true> *)s,(uint)closeFrame.code,message);
          return true;
        }
        WebSocket<true,_true>::send((WebSocket<true,_true> *)s,(int)length,data,10,0);
        bVar7 = fu2::abi_400::detail::function::operator_cast_to_bool(this + 0x60);
        if (!bVar7) {
          return false;
        }
        (**(code **)(this + 0x78))(this + 0x60,0x10,s);
      }
LAB_00175560:
      iVar2 = us_socket_is_closed(1,s);
      if (iVar2 != 0) {
        return true;
      }
      if (*(char *)(lVar4 + 0x5c) == '\0') {
        return false;
      }
      return true;
    }
    std::__cxx11::string::append((char *)(lVar4 + 0x38),(ulong)data);
    sVar6 = (long)(int)length + (long)*(int *)(lVar4 + 0x58);
    *(int *)(lVar4 + 0x58) = (int)sVar6;
    if (bVar7 || !fin) {
      return false;
    }
    if (opCode == 10) {
      bVar7 = fu2::abi_400::detail::function::operator_cast_to_bool(this + 0x80);
      if (!bVar7) goto LAB_00175404;
      (**(code **)(this + 0x98))(this + 0x80,0x10,s);
    }
    else {
      src = (char *)((*(long *)(lVar4 + 0x38) + *(long *)(lVar4 + 0x40)) - sVar6);
      if (opCode != 9) {
        if (opCode == 8) {
          protocol::parseClosePayload(&closeFrame,src,sVar6);
          sVar6 = CONCAT71(closeFrame.length._1_7_,(char)closeFrame.length);
          goto LAB_0017537c;
        }
        goto LAB_00175404;
      }
      WebSocket<true,_true>::send((WebSocket<true,_true> *)s,(int)sVar6,src,10,0);
      bVar7 = fu2::abi_400::detail::function::operator_cast_to_bool(this + 0x60);
      if (!bVar7) goto LAB_00175404;
      (**(code **)(this + 0x78))(this + 0x60,0x10,s);
    }
    iVar2 = us_socket_is_closed(1,s);
    if (iVar2 != 0) {
      return true;
    }
    if (*(char *)(lVar4 + 0x5c) != '\0') {
      return true;
    }
LAB_00175404:
    std::__cxx11::string::resize((ulong)(lVar4 + 0x38));
    *(undefined4 *)(lVar4 + 0x58) = 0;
    return false;
  }
  lVar5 = *(long *)(lVar4 + 0x40);
  if (bVar7 || !fin) {
    if (lVar5 == 0) {
      std::__cxx11::string::reserve(lVar4 + 0x38);
      lVar5 = *(long *)(lVar4 + 0x40);
    }
  }
  else if (lVar5 == 0) {
    if (*(char *)(lVar4 + 0x5d) == '\x02') {
      *(undefined1 *)(lVar4 + 0x5d) = 1;
      uVar3 = us_socket_context(1,s);
      uVar3 = us_socket_context_loop(1,uVar3);
      lVar5 = us_loop_ext(uVar3);
      compressed._M_str = data;
      compressed._M_len = length;
      InflationStream::inflate
                ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_bool> *)&closeFrame,
                 *(InflationStream **)(lVar5 + 0xe0),*(ZlibContext **)(lVar5 + 0xd8),compressed,
                 *(size_t *)(this + 0xa0));
      if ((char)closeFrame.length != '\x01') goto LAB_001751f7;
      length = CONCAT62(closeFrame._2_6_,closeFrame.code);
      data = closeFrame.message;
    }
    if ((opCode != 1) || (bVar7 = protocol::isValidUtf8((uchar *)data,length), bVar7)) {
      bVar7 = fu2::abi_400::detail::function::operator_cast_to_bool(this);
      if (!bVar7) {
        return false;
      }
      (**(code **)(this + 0x18))(this,0x10,s,length,data,opCode & 0xff);
      goto LAB_00175560;
    }
    goto LAB_001751f7;
  }
  local_58 = (char *)(lVar4 + 0x38);
  bVar1 = refusePayloadLength(lVar5 + length,webSocketState,s);
  if (!bVar1) {
    std::__cxx11::string::append(local_58,(ulong)data);
    if (bVar7 || !fin) {
      return false;
    }
    if (*(char *)(lVar4 + 0x5d) == '\x02') {
      *(undefined1 *)(lVar4 + 0x5d) = 1;
      std::__cxx11::string::append(local_58);
      uVar3 = us_socket_context(1,s);
      uVar3 = us_socket_context_loop(1,uVar3);
      lVar5 = us_loop_ext(uVar3);
      compressed_00._M_len = *(long *)(lVar4 + 0x40) - 4;
      compressed_00._M_str = *(char **)(lVar4 + 0x38);
      InflationStream::inflate
                ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_bool> *)&closeFrame,
                 *(InflationStream **)(lVar5 + 0xe0),*(ZlibContext **)(lVar5 + 0xd8),compressed_00,
                 *(size_t *)(this + 0xa0));
      if ((char)closeFrame.length != '\x01') goto LAB_001751f7;
      sVar6 = CONCAT62(closeFrame._2_6_,closeFrame.code);
      s_00 = (uchar *)closeFrame.message;
    }
    else {
      sVar6 = *(size_t *)(lVar4 + 0x40);
      s_00 = *(uchar **)local_58;
    }
    if ((opCode != 1) || (bVar7 = protocol::isValidUtf8(s_00,sVar6), bVar7)) {
      bVar7 = fu2::abi_400::detail::function::operator_cast_to_bool(this);
      if (bVar7) {
        (**(code **)(this + 0x18))(this,0x10,s,sVar6,s_00,opCode & 0xff);
        iVar2 = us_socket_is_closed(1,s);
        if (iVar2 != 0) {
          return true;
        }
        if (*(char *)(lVar4 + 0x5c) != '\0') {
          return true;
        }
      }
      *(size_t *)(lVar4 + 0x40) = 0;
      **(undefined1 **)local_58 = 0;
      return false;
    }
  }
LAB_001751f7:
  us_socket_close(1,s);
  return true;
}

Assistant:

static bool handleFragment(char *data, size_t length, unsigned int remainingBytes, int opCode, bool fin, uWS::WebSocketState<isServer> *webSocketState, void *s) {
        /* WebSocketData and WebSocketContextData */
        WebSocketContextData<SSL> *webSocketContextData = (WebSocketContextData<SSL> *) us_socket_context_ext(SSL, us_socket_context(SSL, (us_socket_t *) s));
        WebSocketData *webSocketData = (WebSocketData *) us_socket_ext(SSL, (us_socket_t *) s);

        /* Is this a non-control frame? */
        if (opCode < 3) {
            /* Did we get everything in one go? */
            if (!remainingBytes && fin && !webSocketData->fragmentBuffer.length()) {

                /* Handle compressed frame */
                if (webSocketData->compressionStatus == WebSocketData::CompressionStatus::COMPRESSED_FRAME) {
                        webSocketData->compressionStatus = WebSocketData::CompressionStatus::ENABLED;

                        LoopData *loopData = (LoopData *) us_loop_ext(us_socket_context_loop(SSL, us_socket_context(SSL, (us_socket_t *) s)));
                        auto [inflatedFrame, valid] = loopData->inflationStream->inflate(loopData->zlibContext, {data, length}, webSocketContextData->maxPayloadLength);
                        if (!valid) {
                            forceClose(webSocketState, s);
                            return true;
                        } else {
                            data = (char *) inflatedFrame.data();
                            length = inflatedFrame.length();
                        }
                }

                /* Check text messages for Utf-8 validity */
                if (opCode == 1 && !protocol::isValidUtf8((unsigned char *) data, length)) {
                    forceClose(webSocketState, s);
                    return true;
                }

                /* Emit message event & break if we are closed or shut down when returning */
                if (webSocketContextData->messageHandler) {
                    webSocketContextData->messageHandler((WebSocket<SSL, isServer> *) s, std::string_view(data, length), (uWS::OpCode) opCode);
                    if (us_socket_is_closed(SSL, (us_socket_t *) s) || webSocketData->isShuttingDown) {
                        return true;
                    }
                }
            } else {
                /* Allocate fragment buffer up front first time */
                if (!webSocketData->fragmentBuffer.length()) {
                    webSocketData->fragmentBuffer.reserve(length + remainingBytes);
                }
                /* Fragments forming a big message are not caught until appending them */
                if (refusePayloadLength(length + webSocketData->fragmentBuffer.length(), webSocketState, s)) {
                    forceClose(webSocketState, s);
                    return true;
                }
                webSocketData->fragmentBuffer.append(data, length);

                /* Are we done now? */
                // todo: what if we don't have any remaining bytes yet we are not fin? forceclose!
                if (!remainingBytes && fin) {

                    /* Handle compression */
                    if (webSocketData->compressionStatus == WebSocketData::CompressionStatus::COMPRESSED_FRAME) {
                            webSocketData->compressionStatus = WebSocketData::CompressionStatus::ENABLED;

                            // what's really the story here?
                            webSocketData->fragmentBuffer.append("....");

                            LoopData *loopData = (LoopData *) us_loop_ext(
                                us_socket_context_loop(SSL,
                                    us_socket_context(SSL, (us_socket_t *) s)
                                )
                            );

                            auto [inflatedFrame, valid] = loopData->inflationStream->inflate(loopData->zlibContext, {webSocketData->fragmentBuffer.data(), webSocketData->fragmentBuffer.length() - 4}, webSocketContextData->maxPayloadLength);
                            if (!valid) {
                                forceClose(webSocketState, s);
                                return true;
                            } else {
                                data = (char *) inflatedFrame.data();
                                length = inflatedFrame.length();
                            }


                    } else {
                        // reset length and data ptrs
                        length = webSocketData->fragmentBuffer.length();
                        data = webSocketData->fragmentBuffer.data();
                    }

                    /* Check text messages for Utf-8 validity */
                    if (opCode == 1 && !protocol::isValidUtf8((unsigned char *) data, length)) {
                        forceClose(webSocketState, s);
                        return true;
                    }

                    /* Emit message and check for shutdown or close */
                    if (webSocketContextData->messageHandler) {
                        webSocketContextData->messageHandler((WebSocket<SSL, isServer> *) s, std::string_view(data, length), (uWS::OpCode) opCode);
                        if (us_socket_is_closed(SSL, (us_socket_t *) s) || webSocketData->isShuttingDown) {
                            return true;
                        }
                    }

                    /* If we shutdown or closed, this will be taken care of elsewhere */
                    webSocketData->fragmentBuffer.clear();
                }
            }
        } else {
            /* Control frames need the websocket to send pings, pongs and close */
            WebSocket<SSL, isServer> *webSocket = (WebSocket<SSL, isServer> *) s;

            if (!remainingBytes && fin && !webSocketData->controlTipLength) {
                if (opCode == CLOSE) {
                    auto closeFrame = protocol::parseClosePayload(data, length);
                    webSocket->end(closeFrame.code, std::string_view(closeFrame.message, closeFrame.length));
                    return true;
                } else {
                    if (opCode == PING) {
                        webSocket->send(std::string_view(data, length), (OpCode) OpCode::PONG);
                        if (webSocketContextData->pingHandler) {
                            webSocketContextData->pingHandler(webSocket);
                            if (us_socket_is_closed(SSL, (us_socket_t *) s) || webSocketData->isShuttingDown) {
                                return true;
                            }
                        }
                    } else if (opCode == PONG) {
                        if (webSocketContextData->pongHandler) {
                            webSocketContextData->pongHandler(webSocket);
                            if (us_socket_is_closed(SSL, (us_socket_t *) s) || webSocketData->isShuttingDown) {
                                return true;
                            }
                        }
                    }
                }
            } else {
                /* Here we never mind any size optimizations as we are in the worst possible path */
                webSocketData->fragmentBuffer.append(data, length);
                webSocketData->controlTipLength += (int) length;

                if (!remainingBytes && fin) {
                    char *controlBuffer = (char *) webSocketData->fragmentBuffer.data() + webSocketData->fragmentBuffer.length() - webSocketData->controlTipLength;
                    if (opCode == CLOSE) {
                        protocol::CloseFrame closeFrame = protocol::parseClosePayload(controlBuffer, webSocketData->controlTipLength);
                        webSocket->end(closeFrame.code, std::string_view(closeFrame.message, closeFrame.length));
                        return true;
                    } else {
                        if (opCode == PING) {
                            webSocket->send(std::string_view(controlBuffer, webSocketData->controlTipLength), (OpCode) OpCode::PONG);
                            if (webSocketContextData->pingHandler) {
                                webSocketContextData->pingHandler(webSocket);
                                if (us_socket_is_closed(SSL, (us_socket_t *) s) || webSocketData->isShuttingDown) {
                                    return true;
                                }
                            }
                        } else if (opCode == PONG) {
                            if (webSocketContextData->pongHandler) {
                                webSocketContextData->pongHandler(webSocket);
                                if (us_socket_is_closed(SSL, (us_socket_t *) s) || webSocketData->isShuttingDown) {
                                    return true;
                                }
                            }
                        }
                    }

                    /* Same here, we do not care for any particular smart allocation scheme */
                    webSocketData->fragmentBuffer.resize(webSocketData->fragmentBuffer.length() - webSocketData->controlTipLength);
                    webSocketData->controlTipLength = 0;
                }
            }
        }
        return false;
    }